

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O1

void __thiscall
QNetworkReplyHttpImplPrivate::replyDownloadData(QNetworkReplyHttpImplPrivate *this,QByteArray d)

{
  QDecompressHelper *this_00;
  QByteArray *this_01;
  int iVar1;
  __atomic_base<int> _Var2;
  QObject *this_02;
  QArrayData *pQVar3;
  QArrayData *pQVar4;
  Data *pDVar5;
  element_type *peVar6;
  char cVar7;
  bool bVar8;
  bool bVar9;
  qint64 qVar10;
  ssize_t sVar11;
  size_t in_RCX;
  _Storage<long_long,_true> _t2;
  QByteArray *in_RSI;
  qint64 qVar12;
  long lVar13;
  long in_FS_OFFSET;
  QByteArrayView value;
  QByteArrayView QVar14;
  optional<long_long> oVar15;
  QAnyStringView QVar16;
  QAnyStringView QVar17;
  QArrayData *local_88;
  int local_80;
  QChar local_78;
  pair<QByteArray,_QByteArray> local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = *(QObject **)&(this->super_QNetworkReplyPrivate).field_0x8;
  cVar7 = QIODevice::isOpen();
  if (cVar7 != '\0') {
    pQVar3 = (QArrayData *)(in_RSI->d).size;
    if (((this->cacheEnabled == true) &&
        ((this->super_QNetworkReplyPrivate).operation - HeadOperation < 2)) &&
       (this->cacheSaveDevice == (QIODevice *)0x0)) {
      initCacheSaveDevice(this);
    }
    this_00 = &this->decompressHelper;
    bVar8 = QDecompressHelper::isValid(this_00);
    if (bVar8) {
      bVar8 = QDecompressHelper::isCountingBytes(this_00);
      qVar12 = -1;
      if (bVar8) {
        qVar12 = QDecompressHelper::uncompressedSize(this_00);
      }
      QDecompressHelper::feed(this_00,in_RSI);
      bVar8 = QDecompressHelper::isValid(this_00);
      if (!bVar8) {
        QCoreApplication::translate((char *)&local_70,"QHttp","Decompression failed: %1",0);
        QDecompressHelper::errorString(this_00);
        QVar17.m_size = (size_t)&local_70;
        QVar17.field_0.m_data = &local_70.second;
        QString::arg_impl(QVar17,local_80,local_78);
        error(this,UnknownContentError,(QString *)&local_70.second);
        if (&(local_70.second.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_70.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_70.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
               + -1;
          UNLOCK();
          if (((local_70.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate(&(local_70.second.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (local_88 != (QArrayData *)0x0) {
          LOCK();
          (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_88,2,0x10);
          }
        }
        if (&(local_70.first.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_70.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_70.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
               + -1;
          UNLOCK();
          if (((local_70.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate(&(local_70.first.d.d)->super_QArrayData,2,0x10);
          }
        }
        QDecompressHelper::clear(this_00);
        goto LAB_0021b744;
      }
      bVar8 = QHttpNetworkRequest::isFollowRedirects(&this->httpRequest);
      if ((!bVar8) || (bVar8 = QHttpNetworkReply::isHttpRedirect(this->statusCode), !bVar8)) {
        bVar8 = QDecompressHelper::isCountingBytes(this_00);
        if (bVar8) {
          qVar10 = QDecompressHelper::uncompressedSize(this_00);
          this->bytesDownloaded = this->bytesDownloaded + (qVar10 - qVar12);
        }
        setupTransferTimeout(this);
      }
      if (this->synchronous == true) {
        pQVar4 = &((in_RSI->d).d)->super_QArrayData;
        (in_RSI->d).d = (Data *)0x0;
        (in_RSI->d).ptr = (char *)0x0;
        (in_RSI->d).size = 0;
        if (pQVar4 != (QArrayData *)0x0) {
          LOCK();
          (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar4,1,0x10);
          }
        }
        lVar13 = 0;
        do {
          bVar8 = QDecompressHelper::hasData(this_00);
          if (!bVar8) {
            QByteArray::resize((longlong)in_RSI);
            QDecompressHelper::clear(this_00);
            break;
          }
          if ((in_RSI->d).size + 0x4000 < 0) {
            QCoreApplication::translate
                      ((char *)&local_70.second,"QHttp","Data downloaded is too large to store",0);
            error(this,UnknownContentError,(QString *)&local_70.second);
            if (&(local_70.second.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_70.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                   = ((local_70.second.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
              iVar1 = ((local_70.second.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i;
              UNLOCK();
              pQVar4 = &(local_70.second.d.d)->super_QArrayData;
joined_r0x0021b58e:
              if (iVar1 == 0) {
                QArrayData::deallocate(pQVar4,2,0x10);
              }
            }
LAB_0021b5a4:
            QDecompressHelper::clear(this_00);
            in_RCX = 0;
          }
          else {
            QByteArray::resize((longlong)in_RSI);
            pDVar5 = (in_RSI->d).d;
            if ((pDVar5 == (Data *)0x0) ||
               (1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
              QByteArray::reallocData((longlong)in_RSI,(AllocationOption)(in_RSI->d).size);
            }
            sVar11 = QDecompressHelper::read
                               (this_00,(int)(in_RSI->d).ptr + (int)lVar13,(void *)0x4000,in_RCX);
            lVar13 = lVar13 + sVar11;
            bVar9 = QDecompressHelper::isValid(this_00);
            in_RCX = CONCAT71((int7)(in_RCX >> 8),1);
            if (!bVar9) {
              QCoreApplication::translate((char *)&local_70,"QHttp","Decompression failed: %1",0);
              QDecompressHelper::errorString(this_00);
              QVar16.m_size = (size_t)&local_70;
              QVar16.field_0.m_data = &local_70.second;
              QString::arg_impl(QVar16,local_80,local_78);
              error(this,UnknownContentError,(QString *)&local_70.second);
              if (&(local_70.second.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_70.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i = ((local_70.second.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_70.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                    ._M_i == 0) {
                  QArrayData::deallocate(&(local_70.second.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (local_88 != (QArrayData *)0x0) {
                LOCK();
                (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_88,2,0x10);
                }
              }
              if (&(local_70.first.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_70.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     = ((local_70.first.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                iVar1 = ((local_70.first.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i;
                UNLOCK();
                pQVar4 = &(local_70.first.d.d)->super_QArrayData;
                goto joined_r0x0021b58e;
              }
              goto LAB_0021b5a4;
            }
          }
        } while ((char)in_RCX != '\0');
        if (bVar8) goto LAB_0021b744;
      }
    }
    if ((this->cacheSaveDevice != (QIODevice *)0x0) &&
       (bVar8 = QDecompressHelper::isValid(this_00), !bVar8)) {
      QIODevice::write((QByteArray *)this->cacheSaveDevice);
    }
    bVar8 = QDecompressHelper::isValid(this_00);
    if ((!bVar8) &&
       ((bVar8 = QHttpNetworkRequest::isFollowRedirects(&this->httpRequest), !bVar8 ||
        (bVar8 = QHttpNetworkReply::isHttpRedirect(this->statusCode), !bVar8)))) {
      QRingBuffer::append(*(QByteArray **)&(this->super_QNetworkReplyPrivate).field_0x90);
      this->bytesDownloaded =
           (long)&(pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + this->bytesDownloaded;
      setupTransferTimeout(this);
    }
    this->bytesBuffered =
         (long)&(pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + this->bytesBuffered;
    peVar6 = (this->pendingDownloadDataEmissions).
             super___shared_ptr<QAtomicInt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    LOCK();
    _Var2._M_i = (peVar6->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
                 super___atomic_base<int>._M_i;
    (peVar6->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (peVar6->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((peVar6->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0 ||
         SBORROW4(_Var2._M_i,1) !=
         (peVar6->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i < 0) &&
       ((bVar8 = QHttpNetworkRequest::isFollowRedirects(&this->httpRequest), !bVar8 ||
        (bVar8 = QHttpNetworkReply::isHttpRedirect(this->statusCode), !bVar8)))) {
      if (this->lastReadyReadEmittedSize == this->bytesDownloaded) {
        if ((this->super_QNetworkReplyPrivate).readBufferMaxSize != 0) {
          local_70.second.d.ptr = (char *)&local_70;
          local_70.second.d.d = (Data *)0x0;
          local_70.first.d.d = (Data *)pQVar3;
          QMetaObject::activate
                    (this_02,&QNetworkReplyHttpImpl::staticMetaObject,3,(void **)&local_70.second);
        }
      }
      else {
        this->lastReadyReadEmittedSize = this->bytesDownloaded;
        this_01 = &local_70.second;
        QNetworkHeadersPrivate::headers((QNetworkHeadersPrivate *)this_01);
        QVar14 = QHttpHeaders::value((QHttpHeaders *)this_01,ContentLength,
                                     (QByteArrayView)ZEXT816(0));
        value.m_data = QVar14.m_data;
        value.m_size = (qsizetype)value.m_data;
        oVar15 = QNetworkHeadersPrivate::toInt((QNetworkHeadersPrivate *)QVar14.m_size,value);
        QHttpHeaders::~QHttpHeaders((QHttpHeaders *)this_01);
        QIODevice::readyRead();
        cVar7 = QElapsedTimer::isValid();
        if (((cVar7 != '\0') && (lVar13 = QElapsedTimer::elapsed(), 99 < lVar13)) &&
           ((bVar8 = QDecompressHelper::isValid(this_00), !bVar8 ||
            (bVar8 = QDecompressHelper::isCountingBytes(this_00), bVar8)))) {
          QElapsedTimer::start();
          _t2._M_value = -1;
          if (((undefined1  [16])
               oVar15.super__Optional_base<long_long,_true,_true>._M_payload.
               super__Optional_payload_base<long_long> & (undefined1  [16])0x1) !=
              (undefined1  [16])0x0) {
            _t2._M_value = oVar15.super__Optional_base<long_long,_true,_true>._M_payload.
                           super__Optional_payload_base<long_long>._M_payload;
          }
          QNetworkReply::downloadProgress
                    ((QNetworkReply *)this_02,this->bytesDownloaded,_t2._M_value);
        }
      }
    }
  }
LAB_0021b744:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyHttpImplPrivate::replyDownloadData(QByteArray d)
{
    Q_Q(QNetworkReplyHttpImpl);

    // If we're closed just ignore this data
    if (!q->isOpen())
        return;

    // cache this, we need it later and it's invalidated when dealing with compressed data
    auto dataSize = d.size();

    if (cacheEnabled && isCachingAllowed() && !cacheSaveDevice)
        initCacheSaveDevice();

    if (decompressHelper.isValid()) {
        qint64 uncompressedBefore = -1;
        if (decompressHelper.isCountingBytes())
            uncompressedBefore = decompressHelper.uncompressedSize();

        decompressHelper.feed(std::move(d));

        if (!decompressHelper.isValid()) {
            error(QNetworkReplyImpl::NetworkError::UnknownContentError,
                  QCoreApplication::translate("QHttp", "Decompression failed: %1")
                          .arg(decompressHelper.errorString()));
            decompressHelper.clear();
            return;
        }

        if (!isHttpRedirectResponse()) {
            if (decompressHelper.isCountingBytes())
                bytesDownloaded += (decompressHelper.uncompressedSize() - uncompressedBefore);
            setupTransferTimeout();
        }

        if (synchronous) {
            d = QByteArray();
            const qsizetype increments = 16 * 1024;
            qint64 bytesRead = 0;
            while (decompressHelper.hasData()) {
                quint64 nextSize = quint64(d.size()) + quint64(increments);
                if (nextSize > quint64(std::numeric_limits<QByteArray::size_type>::max())) {
                    error(QNetworkReplyImpl::NetworkError::UnknownContentError,
                          QCoreApplication::translate("QHttp",
                                                      "Data downloaded is too large to store"));
                    decompressHelper.clear();
                    return;
                }
                d.resize(nextSize);
                bytesRead += decompressHelper.read(d.data() + bytesRead, increments);
                if (!decompressHelper.isValid()) {
                    error(QNetworkReplyImpl::NetworkError::UnknownContentError,
                          QCoreApplication::translate("QHttp", "Decompression failed: %1")
                                  .arg(decompressHelper.errorString()));
                    decompressHelper.clear();
                    return;
                }
            }
            d.resize(bytesRead);
            // we're synchronous so we're not calling this function again; reset the decompressHelper
            decompressHelper.clear();
        }
    }

    // This is going to look a little strange. When downloading data while a
    // HTTP redirect is happening (and enabled), we write the redirect
    // response to the cache. However, we do not append it to our internal
    // buffer as that will contain the response data only for the final
    // response
    // Note: For compressed data this is done in readData()
    if (cacheSaveDevice && !decompressHelper.isValid()) {
        cacheSaveDevice->write(d);
    }

    // if decompressHelper is valid then we have compressed data, and this is handled above
    if (!decompressHelper.isValid() && !isHttpRedirectResponse()) {
        buffer.append(d);
        bytesDownloaded += dataSize;
        setupTransferTimeout();
    }
    bytesBuffered += dataSize;

    int pendingSignals = pendingDownloadDataEmissions->fetchAndSubAcquire(1) - 1;
    if (pendingSignals > 0) {
        // Some more signal emissions to this slot are pending.
        // Instead of writing the downstream data, we wait
        // and do it in the next call we get
        // (signal comppression)
        return;
    }

    if (isHttpRedirectResponse())
        return;

    // This can occur when downloading compressed data as some of the data may be the content
    // encoding's header. Don't emit anything for this.
    if (lastReadyReadEmittedSize == bytesDownloaded) {
        if (readBufferMaxSize)
            emit q->readBufferFreed(dataSize);
        return;
    }
    lastReadyReadEmittedSize = bytesDownloaded;

    const auto totalSizeOpt = QNetworkHeadersPrivate::toInt(
            headers().value(QHttpHeaders::WellKnownHeader::ContentLength));

    emit q->readyRead();
    // emit readyRead before downloadProgress in case this will cause events to be
    // processed and we get into a recursive call (as in QProgressDialog).
    if (downloadProgressSignalChoke.isValid() &&
        downloadProgressSignalChoke.elapsed() >= progressSignalInterval
        && (!decompressHelper.isValid() || decompressHelper.isCountingBytes())) {
        downloadProgressSignalChoke.start();
        emit q->downloadProgress(bytesDownloaded, totalSizeOpt.value_or(-1));
    }
}